

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void get_lot_bounds(chunk_conflict *c,loc xroads,loc lot,wchar_t lot_wid,wchar_t lot_hgt,int *west,
                   int *north,int *east,int *south)

{
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int *west_local;
  wchar_t lot_hgt_local;
  wchar_t lot_wid_local;
  chunk_conflict *c_local;
  loc lot_local;
  loc xroads_local;
  
  c_local._0_4_ = lot.x;
  if (((int)c_local == 0) || (c_local._4_4_ = lot.y, c_local._4_4_ == 0)) {
    *east = 0;
    *west = 0;
    *north = 0;
    *south = 0;
  }
  else {
    lot_local.x = xroads.x;
    if ((int)c_local < 0) {
      if (lot_local.x + -1 + (int)c_local * lot_wid < 3) {
        local_34 = 2;
      }
      else {
        local_34 = lot_local.x + -1 + (int)c_local * lot_wid;
      }
      *west = local_34;
      if (lot_local.x + -2 + ((int)c_local + 1) * lot_wid < c->width + -3) {
        local_38 = lot_local.x + -2 + ((int)c_local + 1) * lot_wid;
      }
      else {
        local_38 = c->width + -3;
      }
      *east = local_38;
    }
    else {
      if (lot_local.x + 2 + ((int)c_local + -1) * lot_wid < 3) {
        local_3c = 2;
      }
      else {
        local_3c = lot_local.x + 2 + ((int)c_local + -1) * lot_wid;
      }
      *west = local_3c;
      if (lot_local.x + 1 + (int)c_local * lot_wid < c->width + -3) {
        local_40 = lot_local.x + 1 + (int)c_local * lot_wid;
      }
      else {
        local_40 = c->width + -3;
      }
      *east = local_40;
    }
    lot_local.y = xroads.y;
    if ((long)lot < 0) {
      if (lot_local.y + c_local._4_4_ * lot_hgt < 3) {
        local_44 = 2;
      }
      else {
        local_44 = lot_local.y + c_local._4_4_ * lot_hgt;
      }
      *north = local_44;
      if (lot_local.y + -1 + (c_local._4_4_ + 1) * lot_hgt < c->height + -3) {
        local_48 = lot_local.y + -1 + (c_local._4_4_ + 1) * lot_hgt;
      }
      else {
        local_48 = c->height + -3;
      }
      *south = local_48;
    }
    else {
      if (lot_local.y + 2 + (c_local._4_4_ + -1) * lot_hgt < 3) {
        local_4c = 2;
      }
      else {
        local_4c = lot_local.y + 2 + (c_local._4_4_ + -1) * lot_hgt;
      }
      *north = local_4c;
      if (lot_local.y + 1 + c_local._4_4_ * lot_hgt < c->height + -3) {
        local_50 = lot_local.y + 1 + c_local._4_4_ * lot_hgt;
      }
      else {
        local_50 = c->height + -3;
      }
      *south = local_50;
    }
  }
  return;
}

Assistant:

static void get_lot_bounds(struct chunk *c, struct loc xroads, struct loc lot,
		int lot_wid, int lot_hgt,
		int *west, int *north, int *east, int *south) {

	// 0 is the road. no lots.
	if (lot.x == 0 || lot.y == 0) {
		*east = 0;
		*west = 0;
		*north = 0;
		*south = 0;
		return;
	}

	if (lot.x < 0) {
		*west = MAX(2, xroads.x - 1 + (lot.x) * lot_wid);
		*east = MIN(c->width - 3, xroads.x - 2 + (lot.x + 1) * lot_wid);
	} else {
		*west = MAX(2, xroads.x + 2 + (lot.x - 1) * lot_wid);
		*east = MIN(c->width - 3, xroads.x + 1 + (lot.x) * lot_wid);
	}

	if (lot.y < 0) {
		*north = MAX(2, xroads.y + (lot.y) * lot_hgt);
		*south = MIN(c->height - 3, xroads.y - 1 + (lot.y + 1) * lot_hgt);
	} else {
		*north = MAX(2, xroads.y + 2 + (lot.y - 1) * lot_hgt);
		*south = MIN(c->height - 3, xroads.y + 1 + (lot.y) * lot_hgt);
	}
}